

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall Js::InterpreterHaltState::SetCurrentOffset(InterpreterHaltState *this,int offset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  ByteCodeReader *this_00;
  int offset_local;
  InterpreterHaltState *this_local;
  
  bVar2 = IsValid(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0x2a,"(IsValid())","IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = (*this->topFrame->_vptr_DiagStackFrame[0xc])();
  if ((uVar3 & 1) == 0) {
    if ((this->exceptionObject != (JavascriptExceptionObject *)0x0) &&
       (bVar2 = JavascriptExceptionObject::IsDebuggerSkip(this->exceptionObject), bVar2)) {
      JavascriptExceptionObject::SetByteCodeOffsetAfterDebuggerSkip(this->exceptionObject,offset);
    }
  }
  else {
    iVar4 = (*this->topFrame->_vptr_DiagStackFrame[0xd])();
    this_00 = InterpreterStackFrame::GetReader
                        ((InterpreterStackFrame *)CONCAT44(extraout_var,iVar4));
    ByteCodeReader::SetCurrentOffset(this_00,offset);
  }
  return;
}

Assistant:

void InterpreterHaltState::SetCurrentOffset(int offset)
    {
        Assert(IsValid());
        if (this->topFrame->IsInterpreterFrame())
        {
            // For interpreter frames, actual scenarios we need changed offset are: set next in topmost frame, ignore exception.
            // For throw exception we don't need it, but it doesn't hurt because interpreter will ignore the offset
            // and rather just throw the exception.
            this->topFrame->AsInterpreterFrame()->GetReader()->SetCurrentOffset(offset);
        }
        else
        {
            // For native frames, the only scenario we need to record changed offset is when we ignore exception.
            if (this->exceptionObject && this->exceptionObject->IsDebuggerSkip())
            {
                this->exceptionObject->SetByteCodeOffsetAfterDebuggerSkip(offset);
            }
        }
    }